

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ans_fold.hpp
# Opt level: O0

size_t ans_fold_compress<6u>(uint8_t *dst,size_t dstCapacity,uint32_t *src,size_t srcSize)

{
  uint8_t **out_u8_00;
  reference pvVar1;
  uint64_t uVar2;
  ans_fold_encode<6U> *this;
  size_t sVar3;
  uint64_t *in_RCX;
  uint8_t *in_RDI;
  size_t unaff_retaddr;
  uint32_t *in_stack_00000008;
  size_t cur_sym;
  array<unsigned_long,_4UL> states;
  uint8_t *out_u8;
  ans_fold_encode<6U> ans_frame;
  uint32_t *in_u32;
  uint8_t **in_stack_ffffffffffffff28;
  ans_fold_encode<6U> *in_stack_ffffffffffffff30;
  ans_fold_encode<6U> *paVar4;
  uint64_t *state;
  ans_fold_encode<6U> *in_stack_ffffffffffffff60;
  uint8_t *local_70;
  ans_fold_encode<6U> local_68;
  uint64_t *local_20;
  uint8_t *local_8;
  
  paVar4 = &local_68;
  local_20 = in_RCX;
  local_8 = in_RDI;
  ans_fold_encode<6U>::create(in_stack_00000008,unaff_retaddr);
  local_70 = local_8;
  ans_fold_encode<6U>::serialize(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  out_u8_00 = (uint8_t **)ans_fold_encode<6U>::initial_state(&local_68);
  pvVar1 = std::array<unsigned_long,_4UL>::operator[]
                     ((array<unsigned_long,_4UL> *)in_stack_ffffffffffffff30,
                      (size_type)in_stack_ffffffffffffff28);
  *pvVar1 = (value_type_conflict2)out_u8_00;
  uVar2 = ans_fold_encode<6U>::initial_state(&local_68);
  pvVar1 = std::array<unsigned_long,_4UL>::operator[]
                     ((array<unsigned_long,_4UL> *)in_stack_ffffffffffffff30,
                      (size_type)in_stack_ffffffffffffff28);
  *pvVar1 = uVar2;
  uVar2 = ans_fold_encode<6U>::initial_state(&local_68);
  pvVar1 = std::array<unsigned_long,_4UL>::operator[]
                     ((array<unsigned_long,_4UL> *)in_stack_ffffffffffffff30,
                      (size_type)in_stack_ffffffffffffff28);
  *pvVar1 = uVar2;
  this = (ans_fold_encode<6U> *)ans_fold_encode<6U>::initial_state(&local_68);
  pvVar1 = std::array<unsigned_long,_4UL>::operator[]
                     ((array<unsigned_long,_4UL> *)this,(size_type)in_stack_ffffffffffffff28);
  *pvVar1 = (value_type_conflict2)this;
  for (state = (uint64_t *)0x0; ((long)local_20 - (long)state & 3U) != 0;
      state = (uint64_t *)((long)state + 1)) {
    std::array<unsigned_long,_4UL>::operator[]
              ((array<unsigned_long,_4UL> *)this,(size_type)in_stack_ffffffffffffff28);
    ans_fold_encode<6U>::encode_symbol
              (in_stack_ffffffffffffff60,state,(uint32_t)((ulong)paVar4 >> 0x20),out_u8_00);
  }
  for (; state != local_20; state = (uint64_t *)((long)state + 4)) {
    std::array<unsigned_long,_4UL>::operator[]
              ((array<unsigned_long,_4UL> *)this,(size_type)in_stack_ffffffffffffff28);
    ans_fold_encode<6U>::encode_symbol
              (in_stack_ffffffffffffff60,state,(uint32_t)((ulong)paVar4 >> 0x20),out_u8_00);
    std::array<unsigned_long,_4UL>::operator[]
              ((array<unsigned_long,_4UL> *)this,(size_type)in_stack_ffffffffffffff28);
    ans_fold_encode<6U>::encode_symbol
              (in_stack_ffffffffffffff60,state,(uint32_t)((ulong)paVar4 >> 0x20),out_u8_00);
    std::array<unsigned_long,_4UL>::operator[]
              ((array<unsigned_long,_4UL> *)this,(size_type)in_stack_ffffffffffffff28);
    ans_fold_encode<6U>::encode_symbol
              (in_stack_ffffffffffffff60,state,(uint32_t)((ulong)paVar4 >> 0x20),out_u8_00);
    std::array<unsigned_long,_4UL>::operator[]
              ((array<unsigned_long,_4UL> *)this,(size_type)in_stack_ffffffffffffff28);
    ans_fold_encode<6U>::encode_symbol
              (in_stack_ffffffffffffff60,state,(uint32_t)((ulong)paVar4 >> 0x20),out_u8_00);
  }
  pvVar1 = std::array<unsigned_long,_4UL>::operator[]
                     ((array<unsigned_long,_4UL> *)this,(size_type)in_stack_ffffffffffffff28);
  ans_fold_encode<6U>::flush_state(&local_68,*pvVar1,&local_70);
  pvVar1 = std::array<unsigned_long,_4UL>::operator[]
                     ((array<unsigned_long,_4UL> *)this,(size_type)in_stack_ffffffffffffff28);
  ans_fold_encode<6U>::flush_state(&local_68,*pvVar1,&local_70);
  pvVar1 = std::array<unsigned_long,_4UL>::operator[]
                     ((array<unsigned_long,_4UL> *)this,(size_type)in_stack_ffffffffffffff28);
  ans_fold_encode<6U>::flush_state(&local_68,*pvVar1,&local_70);
  pvVar1 = std::array<unsigned_long,_4UL>::operator[]
                     ((array<unsigned_long,_4UL> *)this,(size_type)in_stack_ffffffffffffff28);
  ans_fold_encode<6U>::flush_state(&local_68,*pvVar1,&local_70);
  sVar3 = (long)local_70 - (long)local_8;
  ans_fold_encode<6U>::~ans_fold_encode(this);
  return sVar3;
}

Assistant:

size_t ans_fold_compress(
    uint8_t* dst, size_t dstCapacity, const uint32_t* src, size_t srcSize)
{
    auto in_u32 = reinterpret_cast<const uint32_t*>(src);
    auto ans_frame = ans_fold_encode<fidelity>::create(in_u32, srcSize);
    uint8_t* out_u8 = reinterpret_cast<uint8_t*>(dst);

    // serialize model
    ans_frame.serialize(out_u8);

    // start encoding, we encode 4 states at the same time for speed
    std::array<uint64_t, 4> states;
    states[0] = ans_frame.initial_state();
    states[1] = ans_frame.initial_state();
    states[2] = ans_frame.initial_state();
    states[3] = ans_frame.initial_state();

    size_t cur_sym = 0;
    while ((srcSize - cur_sym) % 4 != 0) {
        ans_frame.encode_symbol(
            states[0], in_u32[srcSize - cur_sym - 1], out_u8);
        cur_sym += 1;
    }
    while (cur_sym != srcSize) {
        ans_frame.encode_symbol(
            states[0], in_u32[srcSize - cur_sym - 1], out_u8);
        ans_frame.encode_symbol(
            states[1], in_u32[srcSize - cur_sym - 2], out_u8);
        ans_frame.encode_symbol(
            states[2], in_u32[srcSize - cur_sym - 3], out_u8);
        ans_frame.encode_symbol(
            states[3], in_u32[srcSize - cur_sym - 4], out_u8);
        cur_sym += 4;
    }

    // flush final state
    ans_frame.flush_state(states[0], out_u8);
    ans_frame.flush_state(states[1], out_u8);
    ans_frame.flush_state(states[2], out_u8);
    ans_frame.flush_state(states[3], out_u8);

    return out_u8 - reinterpret_cast<uint8_t*>(dst);
}